

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::
make_uniq_base<duckdb::Expression,duckdb::BoundColumnRefExpression,duckdb::LogicalType_const&,duckdb::ColumnBinding_const&>
          (duckdb *this,LogicalType *args,ColumnBinding *args_1)

{
  BoundColumnRefExpression *this_00;
  LogicalType LStack_38;
  
  this_00 = (BoundColumnRefExpression *)operator_new(0x70);
  LogicalType::LogicalType(&LStack_38,args);
  BoundColumnRefExpression::BoundColumnRefExpression(this_00,&LStack_38,*args_1,0);
  *(BoundColumnRefExpression **)this = this_00;
  LogicalType::~LogicalType(&LStack_38);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<S> make_uniq_base(ARGS &&... args) { // NOLINT: mimic std style
	return unique_ptr<S>(new T(std::forward<ARGS>(args)...));
}